

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O1

vector<Scope,_std::allocator<Scope>_> * __thiscall
TreeIncPruneBGPlanner::GetValidActions
          (vector<Scope,_std::allocator<Scope>_> *__return_storage_ptr__,TreeIncPruneBGPlanner *this
          ,Index depth,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol)

{
  pointer pvVar1;
  pointer pvVar2;
  MultiAgentDecisionProcessDiscreteInterface *pMVar3;
  long lVar4;
  int iVar5;
  PlanningUnitDecPOMDPDiscrete *pPVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  undefined4 extraout_var;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  vector<Scope,_std::allocator<Scope>_> *as;
  Scope aI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Os;
  uint local_74;
  vector<Scope,_std::allocator<Scope>_> *local_70;
  void *local_68;
  iterator iStack_60;
  uint *local_58;
  ulong local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pvVar1 = (jpol->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (jpol->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar6 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar6 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
             _m_puShared.px;
  }
  pMVar3 = (pPVar6->super_PlanningUnitMADPDiscrete)._m_madp;
  local_70 = __return_storage_ptr__;
  __x = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
        (**(code **)((long)*pMVar3 + 0xe8))(pMVar3,depth);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__x);
  (local_70->super__Vector_base<Scope,_std::allocator<Scope>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (local_70->super__Vector_base<Scope,_std::allocator<Scope>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_70->super__Vector_base<Scope,_std::allocator<Scope>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pvVar1 != pvVar2) {
    uVar7 = ((long)pvVar1 - (long)pvVar2 >> 3) * -0x5555555555555555;
    uVar8 = 0;
    local_50 = uVar7;
    do {
      local_68 = (void *)0x0;
      iStack_60._M_current = (uint *)0x0;
      local_58 = (uint *)0x0;
      lVar4 = *(long *)&(jpol->
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar8].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      if (*(int *)(lVar4 + (ulong)local_48.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar8] * 4) == -1) {
        uVar9 = 0;
        while( true ) {
          pPVar6 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                   _m_pu;
          if (pPVar6 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
            pPVar6 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                     _m_puShared.px;
          }
          local_74 = uVar9;
          iVar5 = (*(pPVar6->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit
                    [7])(pPVar6,uVar8);
          uVar7 = local_50;
          if (CONCAT44(extraout_var,iVar5) == (ulong)uVar9) break;
          if (iStack_60._M_current == local_58) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                       &local_74);
          }
          else {
            *iStack_60._M_current = local_74;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          uVar9 = local_74 + 1;
        }
      }
      else {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,(iterator)0x0,
                   (uint *)(lVar4 + (ulong)local_48.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar8] * 4));
      }
      std::vector<Scope,_std::allocator<Scope>_>::push_back(local_70,(value_type *)&local_68);
      if (local_68 != (void *)0x0) {
        operator_delete(local_68,(long)local_58 - (long)local_68);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar7 != uVar8);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return local_70;
}

Assistant:

vector<Scope> TreeIncPruneBGPlanner::GetValidActions(
    Index depth,
    const vector<vector<Index> > &jpol) const
{
    size_t nrAgents=jpol.size();

    vector<Index> Os=GetObservationsFromDepth(depth);
    vector<Scope> as;
    for(Index k=0;k!=nrAgents;++k)
    {
        Scope aI;
        if(jpol[k][Os[k]]==UNSPECIFIED_ACTION)
            // we didn't specify this obs yet, so all actions are valid
            for(Index a=0;a!=GetPU()->GetNrActions(k);++a)
                aI.push_back(a);
        else // we already assigned this obs, so we can only use that
             // particular action
            aI.push_back(jpol[k][Os[k]]);
        as.push_back(aI);
    }

    return(as);
}